

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O1

void __thiscall CVmObjGramProd::mark_alt_refs(CVmObjGramProd *this,vmgram_alt_info *alt,uint state)

{
  uint uVar1;
  anon_union_24_5_d4664839_for_typinfo *paVar2;
  ulong uVar3;
  
  uVar1 = alt->proc_obj;
  if (uVar1 != 0) {
    CVmObjTable::add_to_gc_queue
              (&G_obj_table_X,uVar1,
               (CVmObjPageEntry *)
               ((long)&G_obj_table_X.pages_[uVar1 >> 0xc]->ptr_ + (ulong)((uVar1 & 0xfff) * 0x18)),
               state);
  }
  if (alt->tok_cnt != 0) {
    paVar2 = &alt->toks->typinfo;
    uVar3 = 0;
    do {
      if ((*(uchar *)((long)paVar2 + -6) == '\x01') && (uVar1 = paVar2->prod_obj, uVar1 != 0)) {
        CVmObjTable::add_to_gc_queue
                  (&G_obj_table_X,uVar1,
                   (CVmObjPageEntry *)
                   ((long)&G_obj_table_X.pages_[uVar1 >> 0xc]->ptr_ +
                   (ulong)((uVar1 & 0xfff) * 0x18)),state);
      }
      uVar3 = uVar3 + 1;
      paVar2 = (anon_union_24_5_d4664839_for_typinfo *)((long)paVar2 + 0x20);
    } while (uVar3 < alt->tok_cnt);
  }
  return;
}

Assistant:

void CVmObjGramProd::mark_alt_refs(VMG_ const vmgram_alt_info *alt, uint state)
{
    /* mark the match object */
    if (alt->proc_obj != VM_INVALID_OBJ)
        G_obj_table->mark_all_refs(alt->proc_obj, state);

    /* run through the token list */
    vmgram_tok_info *tok = alt->toks;
    for (size_t j = 0 ; j < alt->tok_cnt ; ++j, ++tok)
    {
        /* only production matches have object references */
        if (tok->typ == VMGRAM_MATCH_PROD
            && tok->typinfo.prod_obj != VM_INVALID_OBJ)
        {
            /* mark the reference */
            G_obj_table->mark_all_refs(tok->typinfo.prod_obj, state);
        }
    }
}